

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O1

void __thiscall
ans_reorder_fold_encode<3U>::encode_symbol
          (ans_reorder_fold_encode<3U> *this,uint64_t *state,uint32_t sym,uint8_t **out_u8)

{
  ushort *puVar1;
  ushort uVar2;
  uint8_t *puVar3;
  pointer peVar4;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ulong uVar10;
  uint uVar11;
  int iVar9;
  
  uVar7 = (this->mapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[sym];
  iVar9 = 0;
  iVar8 = 0;
  uVar11 = uVar7;
  if (0x3ff < uVar7) {
    do {
      puVar3 = *out_u8;
      *out_u8 = puVar3 + 1;
      *puVar3 = (uint8_t)uVar11;
      uVar7 = uVar11 >> 8;
      iVar8 = iVar9 + 0x3fc;
      bVar6 = 0x3ffff < uVar11;
      uVar11 = uVar7;
      iVar9 = iVar8;
    } while (bVar6);
  }
  peVar4 = (this->table).
           super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar10 = (ulong)((iVar8 + uVar7 & 0xffff) << 4);
  puVar1 = (ushort *)((long)&peVar4->freq + uVar10);
  uVar5 = *state;
  if (*(ulong *)((long)&peVar4->sym_upper_bound + uVar10) <= uVar5) {
    puVar3 = *out_u8;
    *(int *)puVar3 = (int)uVar5;
    *out_u8 = puVar3 + 4;
    *state = uVar5 >> 0x20;
  }
  uVar2 = *puVar1;
  *state = (ulong)*(uint *)(puVar1 + 2) + *state % (ulong)uVar2 +
           (*state / (ulong)uVar2) * this->frame_size;
  return;
}

Assistant:

void encode_symbol(uint64_t& state, uint32_t sym, uint8_t*& out_u8)
    {
        auto mapped_sym = ans_reorder_fold_mapping_and_exceptions<fidelity>(
            mapping[sym], out_u8);
        const auto& e = table[mapped_sym];
        if (state >= e.sym_upper_bound) {
            auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
            *out_ptr_u32 = state & 0xFFFFFFFF;
            out_u8 += sizeof(uint32_t);
            state = state >> constants::RADIX_LOG2;
        }
        state = ((state / e.freq) * frame_size) + (state % e.freq) + e.base;
    }